

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPropertyDefinition.cxx
# Opt level: O0

cmPropertyDefinition * __thiscall
cmPropertyDefinitionMap::GetPropertyDefinition
          (cmPropertyDefinitionMap *this,string *name,ScopeType scope)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_70 [3];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  local_58;
  _Self local_30;
  const_iterator it;
  ScopeType scope_local;
  string *name_local;
  cmPropertyDefinitionMap *this_local;
  
  it._M_node._4_4_ = scope;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  ::pair<cmProperty::ScopeType_&,_true>(&local_58,name,(ScopeType *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
       ::find(&this->Map_,&local_58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>
  ::~pair(&local_58);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>_>
       ::end(&this->Map_);
  bVar1 = std::operator!=(&local_30,local_70);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty::ScopeType>,_cmPropertyDefinition>_>
             ::operator->(&local_30);
    this_local = (cmPropertyDefinitionMap *)&ppVar2->second;
  }
  else {
    this_local = (cmPropertyDefinitionMap *)0x0;
  }
  return (cmPropertyDefinition *)this_local;
}

Assistant:

cmPropertyDefinition const* cmPropertyDefinitionMap::GetPropertyDefinition(
  const std::string& name, cmProperty::ScopeType scope) const
{
  auto it = this->Map_.find(KeyType(name, scope));
  if (it != this->Map_.end()) {
    return &it->second;
  }

  return nullptr;
}